

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

void __thiscall booster::locale::date_time::date_time(date_time *this)

{
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  locale local_30 [2];
  _Impl local_20 [16];
  
  std::locale::locale(local_30);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(local_30);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))(pcVar1);
  (this->impl_).ptr_ = paVar2;
  std::locale::~locale(local_30);
  paVar2 = (this->impl_).ptr_;
  time_zone::global_abi_cxx11_();
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,local_30);
  if (local_30[0]._M_impl != local_20) {
    operator_delete(local_30[0]._M_impl);
  }
  return;
}

Assistant:

date_time::date_time() :
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(time_zone::global());
}